

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetPchUseCompileOptions
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *language,
          string *arch)

{
  cmAlphaNum *this_00;
  cmMakefile *pcVar1;
  bool bVar2;
  pointer ppVar3;
  string *psVar4;
  ulong uVar5;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_const_char_*>_>::value,_pair<iterator,_bool>_>
  _Var6;
  string *local_440;
  allocator<char> local_391;
  string local_390;
  allocator<char> local_369;
  string local_368;
  undefined1 local_348 [8];
  string pchFile;
  string pchHeader;
  cmAlphaNum local_300;
  cmAlphaNum local_2d0;
  string local_2a0;
  cmAlphaNum local_280;
  cmAlphaNum local_250;
  string local_220;
  string *local_200;
  string *useOptionListProperty;
  cmAlphaNum local_1c8;
  undefined1 local_198 [8];
  string useOptVar;
  cmAlphaNum local_148;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  string *local_d0;
  string *useOptionList;
  undefined1 local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
  local_68;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_const_char_*>_>::value,_pair<iterator,_bool>_>
  inserted;
  string *arch_local;
  string *language_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  inserted._8_8_ = arch;
  std::operator+(&local_a8,language,config);
  std::operator+(&local_88,&local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)inserted._8_8_
                );
  std::make_pair<std::__cxx11::string,char_const(&)[1]>(&local_68,&local_88,(char (*) [1])0xd97e77);
  _Var6 = std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::insert<std::pair<std::__cxx11::string,char_const*>>
                    ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&this->PchUseCompileOptions,&local_68);
  useOptionList = (string *)_Var6.first._M_node;
  local_c0 = _Var6.second;
  local_40._M_node = (_Base_ptr)useOptionList;
  inserted.first._M_node._0_1_ = local_c0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
  ::~pair(&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  if (((byte)inserted.first._M_node & 1) != 0) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_40);
    local_d0 = &ppVar3->second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"PCH_WARN_INVALID",&local_f1);
    bVar2 = GetPropertyAsBool(this,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    if (bVar2) {
      pcVar1 = this->Makefile;
      cmAlphaNum::cmAlphaNum(&local_148,"CMAKE_");
      this_00 = (cmAlphaNum *)((long)&useOptVar.field_2 + 8);
      cmAlphaNum::cmAlphaNum(this_00,language);
      cmStrCat<char[29]>(&local_118,&local_148,this_00,(char (*) [29])"_COMPILE_OPTIONS_INVALID_PCH"
                        );
      psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_118);
      std::__cxx11::string::operator=((string *)local_d0,(string *)psVar4);
      std::__cxx11::string::~string((string *)&local_118);
    }
    cmAlphaNum::cmAlphaNum(&local_1c8,language);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&useOptionListProperty,"_COMPILE_OPTIONS_USE_PCH");
    cmStrCat<>((string *)local_198,&local_1c8,(cmAlphaNum *)&useOptionListProperty);
    local_200 = GetSafeProperty(this,(string *)local_198);
    cmAlphaNum::cmAlphaNum(&local_250,local_d0);
    cmAlphaNum::cmAlphaNum(&local_280,";");
    uVar5 = std::__cxx11::string::empty();
    bVar2 = (uVar5 & 1) != 0;
    if (bVar2) {
      pcVar1 = this->Makefile;
      cmAlphaNum::cmAlphaNum(&local_2d0,"CMAKE_");
      cmAlphaNum::cmAlphaNum(&local_300,(string *)local_198);
      cmStrCat<>(&local_2a0,&local_2d0,&local_300);
      local_440 = cmMakefile::GetSafeDefinition(pcVar1,&local_2a0);
    }
    else {
      local_440 = local_200;
    }
    cmStrCat<std::__cxx11::string>(&local_220,&local_250,&local_280,local_440);
    std::__cxx11::string::operator=((string *)local_d0,(string *)&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    if (bVar2) {
      std::__cxx11::string::~string((string *)&local_2a0);
    }
    GetPchHeader((string *)((long)&pchFile.field_2 + 8),this,config,language,
                 (string *)inserted._8_8_);
    GetPchFile((string *)local_348,this,config,language,(string *)inserted._8_8_);
    psVar4 = local_d0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_368,"<PCH_HEADER>",&local_369);
    cmsys::SystemTools::ReplaceString(psVar4,&local_368,(string *)((long)&pchFile.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_368);
    std::allocator<char>::~allocator(&local_369);
    psVar4 = local_d0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,"<PCH_FILE>",&local_391)
    ;
    cmsys::SystemTools::ReplaceString(psVar4,&local_390,(string *)local_348);
    std::__cxx11::string::~string((string *)&local_390);
    std::allocator<char>::~allocator(&local_391);
    std::__cxx11::string::~string((string *)local_348);
    std::__cxx11::string::~string((string *)(pchFile.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_198);
  }
  ppVar3 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator->(&local_40);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&ppVar3->second);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetPchUseCompileOptions(
  const std::string& config, const std::string& language,
  const std::string& arch)
{
  const auto inserted = this->PchUseCompileOptions.insert(
    std::make_pair(language + config + arch, ""));
  if (inserted.second) {
    std::string& useOptionList = inserted.first->second;

    if (this->GetPropertyAsBool("PCH_WARN_INVALID")) {
      useOptionList = this->Makefile->GetSafeDefinition(
        cmStrCat("CMAKE_", language, "_COMPILE_OPTIONS_INVALID_PCH"));
    }

    const std::string useOptVar =
      cmStrCat(language, "_COMPILE_OPTIONS_USE_PCH");

    std::string const& useOptionListProperty =
      this->GetSafeProperty(useOptVar);

    useOptionList = cmStrCat(
      useOptionList, ";",
      useOptionListProperty.empty()
        ? this->Makefile->GetSafeDefinition(cmStrCat("CMAKE_", useOptVar))
        : useOptionListProperty);

    const std::string pchHeader = this->GetPchHeader(config, language, arch);
    const std::string pchFile = this->GetPchFile(config, language, arch);

    cmSystemTools::ReplaceString(useOptionList, "<PCH_HEADER>", pchHeader);
    cmSystemTools::ReplaceString(useOptionList, "<PCH_FILE>", pchFile);
  }
  return inserted.first->second;
}